

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.h
# Opt level: O2

cl_platform_id __thiscall CLIntercept::getPlatform(CLIntercept *this,cl_command_queue queue)

{
  cl_platform_id p_Var1;
  cl_device_id device;
  
  device = (cl_device_id)0x0;
  (*(this->m_Dispatch).clGetCommandQueueInfo)(queue,0x1091,8,&device,(size_t *)0x0);
  p_Var1 = getPlatform(this,device);
  return p_Var1;
}

Assistant:

inline cl_platform_id CLIntercept::getPlatform( cl_command_queue queue ) const
{
    cl_device_id device = NULL;
    dispatch().clGetCommandQueueInfo(
        queue,
        CL_QUEUE_DEVICE,
        sizeof(device),
        &device,
        NULL );
    return getPlatform(device);
}